

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<nonstd::span_lite::span<char,18446744073709551615ul>const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::span_lite::span<char,18446744073709551615ul>const&> *this,
          span<unsigned_char,_18446744073709551615UL> *rhs)

{
  lest *this_00;
  bool bVar1;
  span<unsigned_char,_18446744073709551615UL> *in_R8;
  allocator local_d1;
  span<char,_18446744073709551615UL> local_d0 [2];
  string local_b0;
  string local_90 [32];
  string local_70 [32];
  undefined1 local_50 [40];
  
  bVar1 = nonstd::span_lite::operator==(*(span<char,_18446744073709551615UL> **)this,rhs);
  this_00 = *(lest **)this;
  std::__cxx11::string::string(local_70,"==",&local_d1);
  std::__cxx11::string::string((string *)local_d0,local_70);
  to_string<nonstd::span_lite::span<char,18446744073709551615ul>,nonstd::span_lite::span<unsigned_char,18446744073709551615ul>>
            (&local_b0,this_00,local_d0,(string *)rhs,in_R8);
  std::__cxx11::string::string(local_90,(string *)&local_b0);
  local_50[0] = bVar1;
  std::__cxx11::string::string((string *)(local_50 + 8),local_90);
  result::result(__return_storage_ptr__,(result *)local_50);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

result operator!=( R const & rhs ) { return result( lhs != rhs, to_string( lhs, "!=", rhs ) ); }